

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void assign_big_endian(uchar *ptr,size_t ptrlen,uint32_t val)

{
  int iVar1;
  int shift;
  size_t i;
  uint32_t val_local;
  size_t ptrlen_local;
  uchar *ptr_local;
  
  for (i = 0; i < ptrlen; i = i + 1) {
    iVar1 = ((int)ptrlen + -1) - (int)i;
    if (iVar1 < 4) {
      ptr[i] = (uchar)(val >> ((byte)iVar1 & 0x1f));
    }
    else {
      ptr[i] = '\0';
    }
  }
  return;
}

Assistant:

static void assign_big_endian(unsigned char *ptr, size_t ptrlen, uint32_t val) {
    size_t i;
    for (i = 0; i < ptrlen; i++) {
        int shift = ptrlen - 1 - i;
        if (shift >= 4) {
            ptr[i] = 0;
        } else {
            ptr[i] = (val >> shift) & 0xFF;
        }
    }
}